

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.h
# Opt level: O0

pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> * __thiscall
winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::MethodDef>
          (pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *__return_storage_ptr__,
          row_base<winmd::reader::TypeDef> *this,uint32_t column)

{
  uint uVar1;
  uint32_t uVar2;
  database *pdVar3;
  table_base *this_00;
  char *pcVar4;
  char *__s;
  MethodDef MVar5;
  value_type vVar6;
  TypeDef TVar7;
  row_base<winmd::reader::TypeDef> local_f8;
  table_base *local_e8;
  uint32_t local_e0;
  row_base<winmd::reader::MethodDef> local_d8;
  row_base<winmd::reader::MethodDef> local_c8;
  table_base *local_b8;
  uint32_t local_b0;
  table_base *local_a8;
  uint32_t local_a0;
  undefined1 local_98 [8];
  MethodDef last;
  row_base<winmd::reader::MethodDef> local_58;
  row_base<winmd::reader::MethodDef> local_48;
  undefined1 local_38 [8];
  value_type first;
  table<winmd::reader::MethodDef> *target_table;
  table<winmd::reader::TypeDef> *my_table;
  uint32_t column_local;
  row_base<winmd::reader::TypeDef> *this_local;
  
  pdVar3 = get_database(this);
  this_00 = &reader::database::get_table<winmd::reader::TypeDef>(pdVar3)->super_table_base;
  pdVar3 = get_database(this);
  first.super_row_base<winmd::reader::MethodDef>._8_8_ =
       reader::database::get_table<winmd::reader::MethodDef>(pdVar3);
  MVar5 = table<winmd::reader::MethodDef>::begin
                    ((table<winmd::reader::MethodDef> *)
                     first.super_row_base<winmd::reader::MethodDef>._8_8_);
  local_58.m_table = MVar5.super_row_base<winmd::reader::MethodDef>.m_table;
  local_58.m_index = MVar5.super_row_base<winmd::reader::MethodDef>.m_index;
  uVar1 = get_value<unsigned_int>(this,column);
  vVar6 = row_base<winmd::reader::MethodDef>::operator+(&local_58,uVar1);
  local_48.m_table = vVar6.super_row_base<winmd::reader::MethodDef>.m_table;
  local_48.m_index = vVar6.super_row_base<winmd::reader::MethodDef>.m_index;
  __s = (char *)0x1;
  vVar6 = row_base<winmd::reader::MethodDef>::operator-(&local_48,1);
  last.super_row_base<winmd::reader::MethodDef>._8_8_ =
       vVar6.super_row_base<winmd::reader::MethodDef>.m_table;
  first.super_row_base<winmd::reader::MethodDef>.m_table._0_4_ =
       vVar6.super_row_base<winmd::reader::MethodDef>.m_index;
  local_38 = (undefined1  [8])last.super_row_base<winmd::reader::MethodDef>._8_8_;
  MVar5 = table<winmd::reader::MethodDef>::end
                    ((table<winmd::reader::MethodDef> *)
                     first.super_row_base<winmd::reader::MethodDef>._8_8_);
  local_a8 = MVar5.super_row_base<winmd::reader::MethodDef>.m_table;
  local_a0 = MVar5.super_row_base<winmd::reader::MethodDef>.m_index;
  local_98 = (undefined1  [8])local_a8;
  last.super_row_base<winmd::reader::MethodDef>.m_table._0_4_ = local_a0;
  pcVar4 = index(this,__s,local_a0);
  uVar2 = table_base::size(this_00);
  if ((int)pcVar4 + 1U < uVar2) {
    MVar5 = table<winmd::reader::MethodDef>::begin
                      ((table<winmd::reader::MethodDef> *)
                       first.super_row_base<winmd::reader::MethodDef>._8_8_);
    local_e8 = MVar5.super_row_base<winmd::reader::MethodDef>.m_table;
    local_e0 = MVar5.super_row_base<winmd::reader::MethodDef>.m_index;
    local_d8.m_table = local_e8;
    local_d8.m_index = local_e0;
    pcVar4 = index(this,__s,local_e0);
    TVar7 = table<winmd::reader::TypeDef>::operator[]
                      ((table<winmd::reader::TypeDef> *)this_00,(int)pcVar4 + 1);
    local_f8.m_table = TVar7.super_row_base<winmd::reader::TypeDef>.m_table;
    local_f8.m_index = TVar7.super_row_base<winmd::reader::TypeDef>.m_index;
    uVar1 = get_value<unsigned_int>(&local_f8,column);
    vVar6 = row_base<winmd::reader::MethodDef>::operator+(&local_d8,uVar1);
    local_c8.m_table = vVar6.super_row_base<winmd::reader::MethodDef>.m_table;
    local_c8.m_index = vVar6.super_row_base<winmd::reader::MethodDef>.m_index;
    vVar6 = row_base<winmd::reader::MethodDef>::operator-(&local_c8,1);
    local_b8 = vVar6.super_row_base<winmd::reader::MethodDef>.m_table;
    local_b0 = vVar6.super_row_base<winmd::reader::MethodDef>.m_index;
    local_98 = (undefined1  [8])local_b8;
    last.super_row_base<winmd::reader::MethodDef>.m_table._0_4_ = local_b0;
  }
  cppwinrt::std::pair<winmd::reader::MethodDef,_winmd::reader::MethodDef>::
  pair<winmd::reader::MethodDef_&,_winmd::reader::MethodDef_&,_true>
            (__return_storage_ptr__,(MethodDef *)local_38,(MethodDef *)local_98);
  return __return_storage_ptr__;
}

Assistant:

auto row_base<Row>::get_list(uint32_t const column) const
    {
        auto const& my_table = get_database().template get_table<Row>();
        auto const& target_table = get_database().template get_table<T>();

        auto first = target_table.begin() + get_value<uint32_t>(column) - 1;
        auto last = target_table.end();
        if (index() + 1 < my_table.size())
        {
            last = target_table.begin() + my_table[index() + 1].template get_value<uint32_t>(column) - 1;
        }
        return std::pair{ first, last };
    }